

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptIntBounds.cpp
# Opt level: O0

void __thiscall GlobOpt::EmitIntRangeChecks(GlobOpt *this,Instr *instr,Opnd *opnd)

{
  bool bVar1;
  RegOpnd *pRVar2;
  IndirOpnd *pIVar3;
  GlobOptBlockData *this_00;
  Value *this_01;
  ValueInfo *pVVar4;
  IntBoundedValueInfo *pIVar5;
  IntBounds *pIVar6;
  IntRangeValueInfo *pIVar7;
  StackSym *local_60;
  undefined1 local_50 [8];
  anon_class_16_2_c0c38448 EmitBoundCheck;
  int32 upperBound;
  int32 lowerBound;
  Value *value;
  StackSym *sym;
  RegOpnd *regOpnd;
  Opnd *opnd_local;
  Instr *instr_local;
  GlobOpt *this_local;
  
  if ((opnd != (Opnd *)0x0) &&
     ((regOpnd = (RegOpnd *)opnd, opnd_local = (Opnd *)instr, instr_local = (Instr *)this,
      bVar1 = IR::Opnd::IsRegOpnd(opnd), bVar1 ||
      (bVar1 = IR::Opnd::IsIndirOpnd(&regOpnd->super_Opnd), bVar1)))) {
    bVar1 = IR::Opnd::IsIndirOpnd(&regOpnd->super_Opnd);
    if (bVar1) {
      pIVar3 = IR::Opnd::AsIndirOpnd(&regOpnd->super_Opnd);
      pRVar2 = IR::IndirOpnd::GetIndexOpnd(pIVar3);
      if (pRVar2 == (RegOpnd *)0x0) {
        return;
      }
    }
    bVar1 = IR::Opnd::IsRegOpnd(&regOpnd->super_Opnd);
    if (bVar1) {
      local_60 = (StackSym *)IR::Opnd::AsRegOpnd(&regOpnd->super_Opnd);
    }
    else {
      pIVar3 = IR::Opnd::AsIndirOpnd(&regOpnd->super_Opnd);
      local_60 = (StackSym *)IR::IndirOpnd::GetIndexOpnd(pIVar3);
    }
    sym = local_60;
    bVar1 = IR::Opnd::IsInt32((Opnd *)local_60);
    if ((bVar1) || (bVar1 = IR::Opnd::IsUInt32((Opnd *)sym), bVar1)) {
      value = (Value *)IR::Opnd::GetStackSym((Opnd *)sym);
      bVar1 = StackSym::IsTypeSpec((StackSym *)value);
      if (bVar1) {
        value = (Value *)StackSym::GetVarEquivSym_NoCreate((StackSym *)value);
      }
      this_00 = CurrentBlockData(this);
      this_01 = GlobOptBlockData::FindValue(this_00,(Sym *)value);
      if (this_01 != (Value *)0x0) {
        EmitBoundCheck.regOpnd._4_4_ = 0x80000000;
        EmitBoundCheck.regOpnd._0_4_ = 0x7fffffff;
        pVVar4 = ::Value::GetValueInfo(this_01);
        bVar1 = ValueInfo::IsIntBounded(pVVar4);
        if (bVar1) {
          pVVar4 = ::Value::GetValueInfo(this_01);
          pIVar5 = ValueInfo::AsIntBounded(pVVar4);
          pIVar6 = IntBoundedValueInfo::Bounds(pIVar5);
          EmitBoundCheck.regOpnd._4_4_ = IntBounds::ConstantLowerBound(pIVar6);
          pVVar4 = ::Value::GetValueInfo(this_01);
          pIVar5 = ValueInfo::AsIntBounded(pVVar4);
          pIVar6 = IntBoundedValueInfo::Bounds(pIVar5);
          EmitBoundCheck.regOpnd._0_4_ = IntBounds::ConstantUpperBound(pIVar6);
        }
        else {
          pVVar4 = ::Value::GetValueInfo(this_01);
          bVar1 = ValueInfo::IsIntRange(pVVar4);
          if (!bVar1) {
            return;
          }
          pVVar4 = ::Value::GetValueInfo(this_01);
          pIVar7 = ValueInfo::AsIntRange(pVVar4);
          EmitBoundCheck.regOpnd._4_4_ =
               IntConstantBounds::LowerBound(&pIVar7->super_IntConstantBounds);
          pVVar4 = ::Value::GetValueInfo(this_01);
          pIVar7 = ValueInfo::AsIntRange(pVVar4);
          EmitBoundCheck.regOpnd._0_4_ =
               IntConstantBounds::UpperBound(&pIVar7->super_IntConstantBounds);
        }
        local_50 = (undefined1  [8])&opnd_local;
        EmitBoundCheck.instr = (Instr **)&sym;
        if (-0x80000000 < EmitBoundCheck.regOpnd._4_4_) {
          EmitIntRangeChecks::anon_class_16_2_c0c38448::operator()
                    ((anon_class_16_2_c0c38448 *)local_50,CheckLowerIntBound,
                     EmitBoundCheck.regOpnd._4_4_);
        }
        if ((int32)EmitBoundCheck.regOpnd < 0x7fffffff) {
          EmitIntRangeChecks::anon_class_16_2_c0c38448::operator()
                    ((anon_class_16_2_c0c38448 *)local_50,CheckUpperIntBound,
                     (int32)EmitBoundCheck.regOpnd);
        }
      }
    }
  }
  return;
}

Assistant:

void
GlobOpt::EmitIntRangeChecks(IR::Instr* instr, IR::Opnd* opnd)
{
    if (!opnd || 
        (!opnd->IsRegOpnd() && !opnd->IsIndirOpnd()) ||
        (opnd->IsIndirOpnd() && !opnd->AsIndirOpnd()->GetIndexOpnd()))
    {
        return;
    }

    IR::RegOpnd * regOpnd = opnd->IsRegOpnd() ? opnd->AsRegOpnd() : opnd->AsIndirOpnd()->GetIndexOpnd();
    if (!(regOpnd->IsInt32() || regOpnd->IsUInt32()))
    {
        return;
    }
    
    StackSym * sym = regOpnd->GetStackSym();
    if (sym->IsTypeSpec())
    {
        sym = sym->GetVarEquivSym_NoCreate();
    }
    
    Value * value = CurrentBlockData()->FindValue(sym);

    if (!value)
    {
        return;
    }

    int32 lowerBound = INT_MIN;
    int32 upperBound = INT_MAX;
    
    if (value->GetValueInfo()->IsIntBounded())
    {
        lowerBound = value->GetValueInfo()->AsIntBounded()->Bounds()->ConstantLowerBound();
        upperBound = value->GetValueInfo()->AsIntBounded()->Bounds()->ConstantUpperBound();
    }
    else if (value->GetValueInfo()->IsIntRange())
    {
        lowerBound = value->GetValueInfo()->AsIntRange()->LowerBound();
        upperBound = value->GetValueInfo()->AsIntRange()->UpperBound();
    }
    else
    {
        return;
    }

    const auto EmitBoundCheck = [&](Js::OpCode opcode, int32 bound)
    {
        IR::Opnd * boundOpnd = IR::IntConstOpnd::New(bound, TyInt32, instr->m_func, true /*dontEncode*/);
        IR::Instr * boundCheckInstr = IR::Instr::New(opcode, instr->m_func);
        boundCheckInstr->SetSrc1(regOpnd);
        boundCheckInstr->SetSrc2(boundOpnd);
        instr->InsertBefore(boundCheckInstr);
    };

    if (lowerBound > INT_MIN)
    {
        EmitBoundCheck(Js::OpCode::CheckLowerIntBound, lowerBound);
    }
    if (upperBound < INT_MAX)
    {
        EmitBoundCheck(Js::OpCode::CheckUpperIntBound, upperBound);
    }
}